

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O0

ZyanU8 ZydisCalcRegisterId(ZydisDecoderContext *context,ZydisDecodedInstruction *instruction,
                          ZydisRegisterEncoding encoding,ZydisRegisterClass register_class)

{
  byte local_2a;
  byte local_29;
  ZyanU8 value_1;
  ZyanU8 value;
  ZydisRegisterClass register_class_local;
  ZydisRegisterEncoding encoding_local;
  ZydisDecodedInstruction *instruction_local;
  ZydisDecoderContext *context_local;
  
  if (context == (ZydisDecoderContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x376,
                  "ZyanU8 ZydisCalcRegisterId(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisRegisterEncoding, ZydisRegisterClass)"
                 );
  }
  if (instruction == (ZydisDecodedInstruction *)0x0) {
    __assert_fail("instruction",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x377,
                  "ZyanU8 ZydisCalcRegisterId(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisRegisterEncoding, ZydisRegisterClass)"
                 );
  }
  switch(encoding) {
  case ZYDIS_REG_ENCODING_OPCODE:
    if (((register_class != ZYDIS_REGCLASS_GPR8) && (register_class != ZYDIS_REGCLASS_GPR16)) &&
       ((register_class != ZYDIS_REGCLASS_GPR32 && (register_class != ZYDIS_REGCLASS_GPR64)))) {
      __assert_fail("(register_class == ZYDIS_REGCLASS_GPR8) || (register_class == ZYDIS_REGCLASS_GPR16) || (register_class == ZYDIS_REGCLASS_GPR32) || (register_class == ZYDIS_REGCLASS_GPR64)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x38e,
                    "ZyanU8 ZydisCalcRegisterId(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisRegisterEncoding, ZydisRegisterClass)"
                   );
    }
    local_29 = instruction->opcode & 0xf;
    if (7 < local_29) {
      local_29 = local_29 - 8;
    }
    if (instruction->machine_mode == ZYDIS_MACHINE_MODE_LONG_64) {
      context_local._7_1_ = local_29 | (context->vector_unified).B << 3;
    }
    else {
      context_local._7_1_ = local_29;
    }
    break;
  case ZYDIS_REG_ENCODING_REG:
    context_local._7_1_ = (context->reg_info).id_reg;
    break;
  case ZYDIS_REG_ENCODING_NDSNDD:
    context_local._7_1_ = (context->reg_info).id_ndsndd;
    break;
  case ZYDIS_REG_ENCODING_REQUIRED_BITS:
    context_local._7_1_ = (context->reg_info).id_rm;
    break;
  case ZYDIS_REG_ENCODING_BASE:
    context_local._7_1_ = (context->reg_info).id_base;
    break;
  case ZYDIS_REG_ENCODING_INDEX:
  case ZYDIS_REG_ENCODING_VIDX:
    context_local._7_1_ = (context->reg_info).id_index;
    break;
  case ZYDIS_REG_ENCODING_IS4:
    if (instruction->machine_mode == ZYDIS_MACHINE_MODE_LONG_64) {
      local_2a = (byte)((instruction->raw).imm[0].value.u >> 4) & 0xf;
      if (((instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_EVEX) ||
          (instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE)) &&
         (register_class - ZYDIS_REGCLASS_XMM < 3)) {
        local_2a = local_2a | (byte)(((instruction->raw).imm[0].value.u & 8) << 1);
      }
      context_local._7_1_ = local_2a;
    }
    else {
      context_local._7_1_ = (byte)((instruction->raw).imm[0].value.u >> 4) & 7;
    }
    break;
  case ZYDIS_REG_ENCODING_MASK:
    context_local._7_1_ = (context->vector_unified).mask;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x3b5,
                  "ZyanU8 ZydisCalcRegisterId(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisRegisterEncoding, ZydisRegisterClass)"
                 );
  }
  return context_local._7_1_;
}

Assistant:

static ZyanU8 ZydisCalcRegisterId(const ZydisDecoderContext* context,
    const ZydisDecodedInstruction* instruction, ZydisRegisterEncoding encoding,
    ZydisRegisterClass register_class)
{
    ZYAN_ASSERT(context);
    ZYAN_ASSERT(instruction);

    // TODO: Combine OPCODE and IS4 in `ZydisPopulateRegisterIds` and get rid of this
    // TODO: function entirely

    switch (encoding)
    {
    case ZYDIS_REG_ENCODING_REG:
        return context->reg_info.id_reg;
    case ZYDIS_REG_ENCODING_NDSNDD:
        return context->reg_info.id_ndsndd;
    case ZYDIS_REG_ENCODING_RM:
        return context->reg_info.id_rm;
    case ZYDIS_REG_ENCODING_BASE:
        return context->reg_info.id_base;
    case ZYDIS_REG_ENCODING_INDEX:
    case ZYDIS_REG_ENCODING_VIDX:
        return context->reg_info.id_index;
    case ZYDIS_REG_ENCODING_OPCODE:
    {
        ZYAN_ASSERT((register_class == ZYDIS_REGCLASS_GPR8) ||
                    (register_class == ZYDIS_REGCLASS_GPR16) ||
                    (register_class == ZYDIS_REGCLASS_GPR32) ||
                    (register_class == ZYDIS_REGCLASS_GPR64));
        ZyanU8 value = (instruction->opcode & 0x0F);
        if (value > 7)
        {
            value = value - 8;
        }
        if (instruction->machine_mode != ZYDIS_MACHINE_MODE_LONG_64)
        {
            return value;
        }
        return value | (context->vector_unified.B << 3);
    }
    case ZYDIS_REG_ENCODING_IS4:
    {
        if (instruction->machine_mode != ZYDIS_MACHINE_MODE_LONG_64)
        {
            return (instruction->raw.imm[0].value.u >> 4) & 0x07;
        }
        ZyanU8 value = (instruction->raw.imm[0].value.u >> 4) & 0x0F;
        // We have to check the instruction-encoding, because the extension by bit [3] is only
        // valid for EVEX and MVEX instructions
        if ((instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_EVEX) ||
            (instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_MVEX))
        {
            switch (register_class)
            {
            case ZYDIS_REGCLASS_XMM:
            case ZYDIS_REGCLASS_YMM:
            case ZYDIS_REGCLASS_ZMM:
                value |= ((instruction->raw.imm[0].value.u & 0x08) << 1);
            default:
                break;
            }
        }
        return value;
    }
    case ZYDIS_REG_ENCODING_MASK:
        return context->vector_unified.mask;
    default:
        ZYAN_UNREACHABLE;
    }
}